

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_functs.hpp
# Opt level: O2

bool Limonp::utf8ToUnicode
               (char *str,uint len,vector<unsigned_short,_std::allocator<unsigned_short>_> *vec)

{
  byte bVar1;
  pointer puVar2;
  int iVar3;
  ulong in_RAX;
  ulong uVar4;
  uint i;
  uint uVar5;
  bool bVar6;
  undefined8 uStack_38;
  
  if (str == (char *)0x0) {
    return false;
  }
  puVar2 = (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  uVar5 = 0;
  uStack_38 = in_RAX;
  do {
    bVar6 = len <= uVar5;
    if (bVar6) {
      return bVar6;
    }
    uVar4 = (ulong)uVar5;
    bVar1 = str[uVar4];
    if ((char)bVar1 < '\0') {
      if (bVar1 < 0xe0) {
        if ((uint)(uVar4 + 1) < len) {
          uStack_38._0_6_ =
               CONCAT24((bVar1 & 0x1c) << 6 |
                        (ushort)(byte)(bVar1 << 6) | (byte)str[uVar4 + 1] & 0x3f,
                        (undefined4)uStack_38);
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                    (vec,(unsigned_short *)((long)&uStack_38 + 4));
          iVar3 = 2;
          goto LAB_001130d8;
        }
      }
      else if (0xef < bVar1) {
        return bVar6;
      }
      if (len <= uVar5 + 2) {
        return bVar6;
      }
      uStack_38._0_4_ =
           CONCAT22((ushort)(byte)((byte)str[uVar4 + 1] >> 2 & 0xf | bVar1 << 4) << 8 |
                    (ushort)(byte)(str[uVar4 + 1] << 6) | (byte)str[uVar5 + 2] & 0x3f,
                    (undefined2)uStack_38);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (vec,(unsigned_short *)((long)&uStack_38 + 2));
      iVar3 = 3;
    }
    else {
      uStack_38 = (ulong)CONCAT16(bVar1,(undefined6)uStack_38);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<unsigned_short>
                (vec,(unsigned_short *)((long)&uStack_38 + 6));
      iVar3 = 1;
    }
LAB_001130d8:
    uVar5 = uVar5 + iVar3;
  } while( true );
}

Assistant:

inline bool utf8ToUnicode(const char * const str, uint len, vector<uint16_t>& vec)
    {
        char ch1, ch2;
        if(!str)
        {
            return false;
        }
        vec.clear();
        for(uint i = 0;i < len;)
        {
            if(!(str[i] & 0x80)) // 0xxxxxxx
            {
                vec.push_back(str[i]);
                i++;
            }
            else if ((unsigned char)str[i] <= 0xdf && i + 1 < len) // 110xxxxxx
            {
                ch1 = (str[i] >> 2) & 0x07;
                ch2 = (str[i+1] & 0x3f) | ((str[i] & 0x03) << 6 );
                vec.push_back(twocharToUint16(ch1, ch2));
                i += 2;
            }
            else if((unsigned char)str[i] <= 0xef && i + 2 < len)
            {
                ch1 = (str[i] << 4) | ((str[i+1] >> 2) & 0x0f );
                ch2 = ((str[i+1]<<6) & 0xc0) | (str[i+2] & 0x3f); 
                vec.push_back(twocharToUint16(ch1, ch2));
                i += 3;
            }
            else
            {
                return false;
            }
        }
        return true;
    }